

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::become_leader(raft_server *this)

{
  int32_t my_id;
  cluster_config *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  log_val_type lVar4;
  int iVar5;
  __int_type_conflict2 leader_id;
  int32 iVar6;
  size_type sVar7;
  element_type *peVar8;
  undefined8 *puVar9;
  long lVar10;
  __int_type_conflict _Var11;
  cluster_config *this_00;
  element_type *this_01;
  element_type *peVar12;
  buffer *this_02;
  size_t sVar13;
  element_type *this_03;
  ulong log_idx;
  raft_server *this_04;
  ptr<log_entry> *entry_00;
  undefined8 uVar14;
  long in_RDI;
  CbReturnCode rc;
  ulong my_term;
  Param param;
  ptr<log_entry> entry;
  ptr<buffer> conf_buf;
  ptr<cluster_config> last_config_cloned;
  ptr<log_entry> le;
  ulong ii;
  ulong e_idx;
  ulong s_idx;
  ptr<cluster_config> last_config;
  ptr<peer> pp;
  peer_itor it;
  ptr<snapshot> nil_snp;
  lock_guard<std::mutex> guard_1;
  ptr<raft_params> params;
  lock_guard<std::mutex> guard;
  memory_order __b_1;
  memory_order __b;
  undefined4 in_stack_fffffffffffffcc8;
  srv_role in_stack_fffffffffffffccc;
  undefined1 __i;
  peer *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  undefined4 in_stack_fffffffffffffd10;
  int in_stack_fffffffffffffd14;
  peer *in_stack_fffffffffffffd18;
  raft_server *in_stack_fffffffffffffd20;
  peer *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  string local_210 [36];
  ReturnCode local_1ec;
  ulong local_1e8;
  Param local_1e0;
  string local_1c8 [32];
  ptr<log_entry> *local_1a8;
  undefined1 local_199;
  raft_server *local_198;
  string local_140 [36];
  undefined4 local_11c;
  undefined1 local_118 [16];
  cluster_config *local_108;
  cluster_config *local_100;
  cluster_config *local_f8;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_d0;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_c8;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_c0 [3];
  string local_a8 [32];
  int in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  raft_server *in_stack_ffffffffffffff80;
  string local_70 [64];
  undefined8 local_30;
  memory_order local_28;
  int local_24;
  undefined8 *local_20;
  undefined8 local_18;
  memory_order local_10;
  int local_c;
  undefined8 *local_8;
  
  stop_election_timer((raft_server *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffcd0,
             (mutex_type *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar3) {
    peVar12 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x277fd1);
    iVar5 = (**(code **)(*(long *)peVar12 + 0x38))();
    if (3 < iVar5) {
      peVar12 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x27800a);
      sVar7 = std::
              map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
              ::size((map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
                      *)0x278026);
      msg_if_given_abi_cxx11_((char *)local_70,"number of pending commit elements: %zu",sVar7);
      (**(code **)(*(long *)peVar12 + 0x40))
                (peVar12,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"become_leader",0x3dd,local_70);
      std::__cxx11::string::~string(local_70);
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2780d0);
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x2780e4);
  nuraft::context::get_params
            ((context *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffcd0,
             (mutex_type *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  std::atomic<nuraft::srv_role>::operator=
            ((atomic<nuraft::srv_role> *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
  std::__atomic_base<int>::operator=
            ((__atomic_base<int> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
             (__int_type_conflict2)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
  std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x278176);
  timer_helper::set_duration_ms
            ((timer_helper *)in_stack_fffffffffffffcd0,
             CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  timer_helper::reset((timer_helper *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0))
  ;
  peVar8 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2781b3);
  (**(code **)(*(long *)peVar8 + 0x10))();
  std::__atomic_base<unsigned_long>::operator=
            ((__atomic_base<unsigned_long> *)
             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar3) {
    peVar12 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x27821a);
    iVar5 = (**(code **)(*(long *)peVar12 + 0x38))();
    if (3 < iVar5) {
      peVar12 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x278253);
      puVar9 = (undefined8 *)(in_RDI + 0xa8);
      local_c = 5;
      local_8 = puVar9;
      local_10 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      if (local_c - 1U < 2) {
        local_18 = *puVar9;
      }
      else if (local_c == 5) {
        local_18 = *puVar9;
      }
      else {
        local_18 = *puVar9;
      }
      uVar14 = local_18;
      puVar9 = (undefined8 *)(in_RDI + 0x90);
      local_24 = 5;
      local_20 = puVar9;
      local_28 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      if (local_24 - 1U < 2) {
        local_30 = *puVar9;
      }
      else if (local_24 == 5) {
        local_30 = *puVar9;
      }
      else {
        local_30 = *puVar9;
      }
      uVar2 = local_30;
      peVar8 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2783e8);
      lVar10 = (**(code **)(*(long *)peVar8 + 0x10))();
      msg_if_given_abi_cxx11_
                ((char *)local_a8,
                 "state machine commit index %lu, precommit index %lu, last log index %lu",uVar14,
                 uVar2,lVar10 + -1);
      (**(code **)(*(long *)peVar12 + 0x40))
                (peVar12,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"become_leader",0x3ed,local_a8);
      std::__cxx11::string::~string(local_a8);
    }
  }
  std::shared_ptr<nuraft::snapshot>::shared_ptr((shared_ptr<nuraft::snapshot> *)0x2784eb);
  local_c8._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
       ::begin((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  std::__detail::
  _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
  _Node_const_iterator
            ((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
              *)in_stack_fffffffffffffcd0,
             (_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false> *)
             CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  while( true ) {
    local_d0._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::end((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    bVar3 = std::__detail::operator!=(local_c0,&local_d0);
    if (!bVar3) break;
    std::__detail::
    _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
    operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                *)0x278563);
    std::shared_ptr<nuraft::peer>::shared_ptr
              ((shared_ptr<nuraft::peer> *)in_stack_fffffffffffffcd0,
               (shared_ptr<nuraft::peer> *)
               CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffcd0);
    clear_snapshot_sync_ctx
              ((raft_server *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
               in_stack_fffffffffffffd58);
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2785ab);
    peVar8 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2785c7);
    (**(code **)(*(long *)peVar8 + 0x10))();
    peer::set_next_log_idx
              (in_stack_fffffffffffffcd0,
               CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffcd0);
    enable_hb_for_peer(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x278620);
    std::__detail::
    _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
    operator++((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                *)in_stack_fffffffffffffcd0);
  }
  get_config((raft_server *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  _Var11 = std::__atomic_base::operator_cast_to_unsigned_long
                     ((__atomic_base<unsigned_long> *)
                      CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  local_f8 = (cluster_config *)(_Var11 + 1);
  peVar8 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2786a2);
  this_00 = (cluster_config *)(**(code **)(*(long *)peVar8 + 0x10))();
  local_100 = this_00;
  for (local_108 = local_f8; local_108 < local_100;
      local_108 = (cluster_config *)((long)&local_108->log_idx_ + 1)) {
    peVar8 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x278702);
    (**(code **)(*(long *)peVar8 + 0x50))(local_118,peVar8,local_108);
    this_01 = std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x27872d);
    lVar4 = log_entry::get_val_type(this_01);
    if (lVar4 == conf) {
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar3) {
        peVar12 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2787d9);
        iVar5 = (**(code **)(*(long *)peVar12 + 0x38))();
        if (3 < iVar5) {
          peVar12 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x278812);
          pcVar1 = local_108;
          std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x278837);
          this_02 = log_entry::get_buf((log_entry *)
                                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0)
                                      );
          sVar13 = nuraft::buffer::size(this_02);
          msg_if_given_abi_cxx11_
                    ((char *)local_140,"found uncommitted config at %lu, size %zu",pcVar1,sVar13);
          (**(code **)(*(long *)peVar12 + 0x40))
                    (peVar12,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"become_leader",0x405,local_140);
          std::__cxx11::string::~string(local_140);
        }
      }
      std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x2788f8);
      log_entry::get_buf((log_entry *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0))
      ;
      cluster_config::deserialize
                ((buffer *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      std::shared_ptr<nuraft::cluster_config>::operator=
                ((shared_ptr<nuraft::cluster_config> *)in_stack_fffffffffffffcd0,
                 (shared_ptr<nuraft::cluster_config> *)
                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      std::shared_ptr<nuraft::cluster_config>::~shared_ptr
                ((shared_ptr<nuraft::cluster_config> *)0x27893d);
      local_11c = 0;
    }
    else {
      local_11c = 7;
    }
    std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x278955);
  }
  std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x27899e);
  cluster_config::serialize(this_00);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffcd0);
  cluster_config::deserialize
            ((buffer *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x2789dc);
  this_03 = std::
            __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2789e9);
  peVar8 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x278a02);
  log_idx = (**(code **)(*(long *)peVar8 + 0x10))();
  cluster_config::set_log_idx(this_03,log_idx);
  std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x278a33);
  cluster_config::serialize(this_00);
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x278a59);
  this_04 = (raft_server *)srv_state::get_term((srv_state *)0x278a61);
  local_199 = 2;
  local_198 = this_04;
  entry_00 = (ptr<log_entry> *)timer_helper::get_timeofday_us();
  local_1a8 = entry_00;
  cs_new<nuraft::log_entry,unsigned_long,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type,unsigned_long>
            ((unsigned_long *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
             (shared_ptr<nuraft::buffer> *)
             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
             (log_val_type *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
             (unsigned_long *)in_stack_fffffffffffffcd0);
  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar3) {
    peVar12 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x278af6);
    in_stack_fffffffffffffd14 = (**(code **)(*(long *)peVar12 + 0x38))();
    if (3 < in_stack_fffffffffffffd14) {
      peVar12 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x278b29);
      peVar8 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x278b42);
      uVar14 = (**(code **)(*(long *)peVar8 + 0x10))();
      msg_if_given_abi_cxx11_((char *)local_1c8,"[BECOME LEADER] appended new config at %lu",uVar14)
      ;
      (**(code **)(*(long *)peVar12 + 0x40))
                (peVar12,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"become_leader",0x414,local_1c8);
      std::__cxx11::string::~string(local_1c8);
    }
  }
  store_log_entry(this_04,entry_00,CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  *(undefined1 *)(in_RDI + 0xe9) = 1;
  std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x278c83);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x278c90);
  std::shared_ptr<nuraft::cluster_config>::~shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)0x278c9d);
  std::shared_ptr<nuraft::cluster_config>::~shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)0x278caa);
  std::shared_ptr<nuraft::snapshot>::~shared_ptr((shared_ptr<nuraft::snapshot> *)0x278cb7);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x278cc4);
  my_id = *(int32_t *)(in_RDI + 0x38);
  leader_id = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base<int> *)
                         CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  cb_func::Param::Param(&local_1e0,my_id,leader_id,-1,(void *)0x0);
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x278d0f);
  local_1e8 = srv_state::get_term((srv_state *)0x278d17);
  local_1e0.ctx = &local_1e8;
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x278d4f);
  local_1ec = cb_func::call((cb_func *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)
                            ,(Type)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                            (Param *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  __i = (undefined1)(in_stack_fffffffffffffccc >> 0x18);
  std::atomic<bool>::operator=((atomic<bool> *)in_stack_fffffffffffffcd0,(bool)__i);
  std::__atomic_base<int>::operator=
            ((__atomic_base<int> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
             (__int_type_conflict2)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
  std::atomic<bool>::operator=((atomic<bool> *)in_stack_fffffffffffffcd0,(bool)__i);
  std::__atomic_base<int>::operator=
            ((__atomic_base<int> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
             (__int_type_conflict2)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
  std::__atomic_base<int>::operator=
            ((__atomic_base<int> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
             (__int_type_conflict2)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
  std::atomic<bool>::operator=((atomic<bool> *)in_stack_fffffffffffffcd0,(bool)__i);
  request_append_entries
            ((raft_server *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  if ((*(int *)(in_RDI + 0x3c) == 0) && (iVar6 = get_num_voting_members(this_04), 1 < iVar6)) {
    bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar3) {
      peVar12 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x278e80);
      iVar5 = (**(code **)(*(long *)peVar12 + 0x38))();
      if (3 < iVar5) {
        peVar12 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x278eb3);
        msg_if_given_abi_cxx11_
                  ((char *)local_210,"[BECOME LEADER] my priority is 0, will resign shortly");
        (**(code **)(*(long *)peVar12 + 0x40))
                  (peVar12,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"become_leader",0x42b,local_210);
        std::__cxx11::string::~string(local_210);
      }
    }
    yield_leadership(in_stack_ffffffffffffff80,(bool)in_stack_ffffffffffffff7f,
                     in_stack_ffffffffffffff78);
  }
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x278fa8);
  return;
}

Assistant:

void raft_server::become_leader() {
    stop_election_timer();

    {   auto_lock(commit_ret_elems_lock_);
        p_in("number of pending commit elements: %zu",
             commit_ret_elems_.size());
    }

    ptr<raft_params> params = ctx_->get_params();
    {   auto_lock(cli_lock_);
        role_ = srv_role::leader;
        leader_ = id_;
        srv_to_join_.reset();
        leadership_transfer_timer_.set_duration_ms
            (params->leadership_transfer_min_wait_time_);
        leadership_transfer_timer_.reset();
        precommit_index_ = log_store_->next_slot() - 1;
        p_in("state machine commit index %" PRIu64 ", "
             "precommit index %" PRIu64 ", last log index %" PRIu64,
             sm_commit_index_.load(),
             precommit_index_.load(),
             log_store_->next_slot() - 1);
        ptr<snapshot> nil_snp;
        for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
            ptr<peer> pp = it->second;
            clear_snapshot_sync_ctx(*pp);
            // Reset RPC client for all peers.
            // NOTE: Now we don't reset client, as we already did it
            //       during pre-vote phase.
            // reconnect_client(*pp);

            pp->set_next_log_idx(log_store_->next_slot());
            enable_hb_for_peer(*pp);
        }

        // If there are uncommitted logs, search if conf log exists.
        ptr<cluster_config> last_config = get_config();

        ulong s_idx = sm_commit_index_ + 1;
        ulong e_idx = log_store_->next_slot();
        for (ulong ii = s_idx; ii < e_idx; ++ii) {
            ptr<log_entry> le = log_store_->entry_at(ii);
            if (le->get_val_type() != log_val_type::conf) continue;

            p_in("found uncommitted config at %" PRIu64 ", size %zu",
                 ii, le->get_buf().size());
            last_config = cluster_config::deserialize(le->get_buf());
        }

        // WARNING: WE SHOULD NOT CHANGE THE ORIGINAL CONTENTS DIRECTLY!
        ptr<cluster_config> last_config_cloned =
            cluster_config::deserialize( *last_config->serialize() );
        last_config_cloned->set_log_idx(log_store_->next_slot());
        ptr<buffer> conf_buf = last_config_cloned->serialize();
        ptr<log_entry> entry
            ( cs_new<log_entry>
              ( state_->get_term(),
                conf_buf,
                log_val_type::conf,
                timer_helper::get_timeofday_us() ) );
        p_in("[BECOME LEADER] appended new config at %" PRIu64, log_store_->next_slot());
        store_log_entry(entry);
        config_changing_ = true;
    }

    cb_func::Param param(id_, leader_);
    ulong my_term = state_->get_term();
    param.ctx = &my_term;
    CbReturnCode rc = ctx_->cb_func_.call(cb_func::BecomeLeader, &param);
    (void)rc; // nothing to do in this callback.

    write_paused_ = false;
    next_leader_candidate_ = -1;
    initialized_ = true;
    pre_vote_.quorum_reject_count_ = 0;
    pre_vote_.failure_count_ = 0;
    data_fresh_ = true;

    request_append_entries();

    if (my_priority_ == 0 && get_num_voting_members() > 1) {
        // If this member's priority is zero, this node owns a temporary
        // leadership. Let other node takeover shortly.
        p_in("[BECOME LEADER] my priority is 0, will resign shortly");
        yield_leadership();
    }
}